

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCore.cc
# Opt level: O3

void __thiscall PowerCore::unimplemented(PowerCore *this,char *name,uint32_t addr)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = *(uint *)((long)this->memoryBases[addr >> 0x1e] + (ulong)addr);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Unimplemented instruction ");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2," at ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,addr);
  poVar2 = std::operator<<(poVar2,": ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::flush<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void PowerCore::unimplemented(const char* name, uint32_t addr)
{
    uint32_t insn = load<uint32_t>(addr);
    std::cerr << "Unimplemented instruction " << name << " at " << std::hex << addr
                << ": " << std::hex << insn << std::endl << std::flush;
    exit(1);
}